

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_nbwait_notify(Integer *nbhandle)

{
  Integer *in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while ((local_c < 100 && (putn_handles[local_c].orighdl != in_RDI))) {
    local_c = local_c + 1;
  }
  if (local_c < 100) {
    nga_wait_internal(nbhandle);
    nga_wait_internal(nbhandle);
    if (putn_handles[local_c].elem_copy != (void *)0x0) {
      free(putn_handles[local_c].elem_copy);
      putn_handles[local_c].elem_copy = (void *)0x0;
    }
    putn_handles[local_c].orighdl = (Integer *)0x0;
  }
  return;
}

Assistant:

void pnga_nbwait_notify(Integer *nbhandle)
{
  int i;

  for (i = 0; i < HANDLES_OUTSTANDING; i++)
    if (putn_handles[i].orighdl == nbhandle)
      break;

  if (i >= HANDLES_OUTSTANDING)
    return; /* Incorrect handle used or maybe wait was called multiple times? */

  nga_wait_internal(&putn_handles[i].firsthdl);
  nga_wait_internal(&putn_handles[i].elementhdl);

  if (putn_handles[i].elem_copy) {
    free(putn_handles[i].elem_copy);
    putn_handles[i].elem_copy = NULL;
  }

  putn_handles[i].orighdl = NULL;
}